

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

int flvtag_addsei(flvtag_t *tag,sei_t *sei)

{
  uint uVar1;
  flvtag_avcpackettype_t fVar2;
  uint32_t uVar3;
  uint32_t cts;
  flvtag_frametype_t type;
  uint uVar4;
  sei_t *to;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  char cVar5;
  uint32_t nalu_size;
  uint8_t nalu_type;
  uint8_t *nalu_data;
  ssize_t size;
  uint8_t *data;
  flvtag_t new_tag;
  sei_t new_sei;
  sei_t *sei_local;
  flvtag_t *tag_local;
  
  fVar2 = flvtag_avcpackettype(tag);
  if (fVar2 == flvtag_avcpackettype_nalu) {
    uVar3 = flvtag_pts(tag);
    sei_init((sei_t *)&new_tag.aloc,(double)uVar3);
    sei_cat(_nalu_size,(sei_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
            in_stack_ffffffffffffff94);
    uVar3 = flvtag_dts(tag);
    cts = flvtag_cts(tag);
    type = flvtag_frametype(tag);
    flvtag_initavc((flvtag_t *)&data,uVar3,cts,type);
    size = (ssize_t)flvtag_payload_data(tag);
    nalu_data = (uint8_t *)flvtag_payload_size(tag);
    while (0 < (long)nalu_data) {
      to = (sei_t *)(size + 4);
      uVar1 = CONCAT13(*(undefined1 *)&to->timestamp,(int3)in_stack_ffffffffffffff9c);
      in_stack_ffffffffffffff9c = uVar1 & 0x1fffffff;
      uVar4 = (uint)*(byte *)size << 0x18 | (uint)*(byte *)(size + 1) << 0x10 |
              (uint)*(byte *)(size + 2) << 8 | (uint)*(byte *)(size + 3);
      size = size + (ulong)(uVar4 + 4);
      nalu_data = nalu_data + -(ulong)(uVar4 + 4);
      cVar5 = (char)(in_stack_ffffffffffffff9c >> 0x18);
      if (cVar5 == '\x06') {
        sei_cat(to,(sei_t *)(CONCAT44(uVar1,uVar4) & 0x1fffffffffffffff),cts);
      }
      else if ((((new_sei.timestamp == 0.0) || (cVar5 == '\a')) || (cVar5 == '\b')) ||
              (cVar5 == '\t')) {
        flvtag_avcwritenal((flvtag_t *)&data,(uint8_t *)to,(ulong)uVar4);
      }
      else {
        flvtag_avcwritesei((flvtag_t *)&data,(sei_t *)&new_tag.aloc);
        flvtag_avcwritenal((flvtag_t *)&data,(uint8_t *)to,(ulong)uVar4);
        sei_free((sei_t *)CONCAT44(cts,uVar3));
      }
    }
    if (new_sei.timestamp != 0.0) {
      flvtag_avcwritesei((flvtag_t *)&data,(sei_t *)&new_tag.aloc);
      sei_free((sei_t *)CONCAT44(cts,uVar3));
    }
    flvtag_swap(tag,(flvtag_t *)&data);
    flvtag_free((flvtag_t *)&data);
    tag_local._4_4_ = 1;
  }
  else {
    tag_local._4_4_ = 0;
  }
  return tag_local._4_4_;
}

Assistant:

int flvtag_addsei(flvtag_t* tag, sei_t* sei)
{
    if (flvtag_avcpackettype_nalu != flvtag_avcpackettype(tag)) {
        return 0;
    }

    sei_t new_sei;
    sei_init(&new_sei, flvtag_pts(tag));
    sei_cat(&new_sei, sei, 1);

    flvtag_t new_tag;
    flvtag_initavc(&new_tag, flvtag_dts(tag), flvtag_cts(tag), flvtag_frametype(tag));

    uint8_t* data = flvtag_payload_data(tag);
    ssize_t size = flvtag_payload_size(tag);

    while (0 < size) {
        uint8_t* nalu_data = &data[LENGTH_SIZE];
        uint8_t nalu_type = nalu_data[0] & 0x1F;
        uint32_t nalu_size = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
        data += LENGTH_SIZE + nalu_size;
        size -= LENGTH_SIZE + nalu_size;

        if (6 == nalu_type) {
            sei_cat(&new_sei, sei, 0); // copy non itu_t_t35 sei messages
        } else if (new_sei.head && 7 != nalu_type && 8 != nalu_type && 9 != nalu_type) {
            flvtag_avcwritesei(&new_tag, &new_sei);
            flvtag_avcwritenal(&new_tag, nalu_data, nalu_size);
            sei_free(&new_sei);
        } else {
            flvtag_avcwritenal(&new_tag, nalu_data, nalu_size);
        }
    }

    // On the off chance we have an empty frame, we still wish to write the sei
    if (new_sei.head) {
        flvtag_avcwritesei(&new_tag, &new_sei);
        sei_free(&new_sei);
    }

    flvtag_swap(tag, &new_tag);
    flvtag_free(&new_tag);
    return 1;
}